

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codafind.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  FILE *__stream;
  char *pcVar3;
  int iVar4;
  int iVar5;
  undefined4 *puVar6;
  undefined8 uVar7;
  undefined4 local_3c;
  char *local_38;
  
  verbosity = 0;
  if (argc != 1) {
    pcVar2 = argv[1];
    cVar1 = *pcVar2;
    if ((((cVar1 != '-') || (pcVar2[1] != 'h')) || (pcVar2[2] != '\0')) &&
       (iVar4 = strcmp(pcVar2,"--help"), iVar4 != 0)) {
      if ((((cVar1 == '-') && (pcVar2[1] == 'v')) && (pcVar2[2] == '\0')) ||
         (iVar4 = strcmp(pcVar2,"--version"), iVar4 == 0)) {
        print_version();
        goto LAB_0010157a;
      }
      if (((argc < 3 || cVar1 != '-') || (pcVar2[1] != 'D')) || (pcVar2[2] != '\0')) {
        iVar4 = coda_set_definition_path_conditional(*argv,0,"../share/coda/definitions");
        if (iVar4 == 0) {
          iVar4 = 1;
          goto LAB_001013de;
        }
      }
      else {
        coda_set_definition_path(argv[2]);
        iVar4 = 3;
LAB_001013de:
        local_3c = 1;
        local_38 = (char *)0x0;
        while (iVar4 < argc) {
          pcVar2 = argv[iVar4];
          cVar1 = *pcVar2;
          if ((((cVar1 == '-') && (pcVar2[1] == 'd')) && (pcVar2[2] == '\0')) ||
             (iVar5 = strcmp(pcVar2,"--disable_conversions"), iVar5 == 0)) {
            local_3c = 0;
            iVar5 = iVar4;
            pcVar3 = local_38;
          }
          else if (((((cVar1 != '-') || (pcVar2[1] != 'f')) || (pcVar2[2] != '\0')) &&
                   (iVar5 = strcmp(pcVar2,"--filter"), iVar5 != 0)) ||
                  ((iVar5 = iVar4 + 1, argc <= iVar5 || (pcVar3 = argv[iVar5], *argv[iVar5] == '-'))
                  )) {
            if (((cVar1 != '-') || ((pcVar2[1] != 'V' || (pcVar2[2] != '\0')))) &&
               (iVar5 = strcmp(pcVar2,"--verbosity"), iVar5 != 0)) {
              if (cVar1 == '-') goto LAB_0010154c;
              break;
            }
            verbosity = 1;
            iVar5 = iVar4;
            pcVar3 = local_38;
          }
          local_38 = pcVar3;
          iVar4 = iVar5 + 1;
        }
        if (argc - iVar4 == 0) {
LAB_0010154c:
          fwrite("ERROR: invalid arguments\n",0x19,1,_stderr);
          print_help();
          goto LAB_0010156d;
        }
        iVar5 = coda_init();
        if (iVar5 == 0) {
          coda_set_option_perform_conversions(local_3c);
          iVar4 = coda_match_filefilter(local_38,argc - iVar4,argv + iVar4,callback,0);
          if (iVar4 == 0) {
            coda_done();
            return 0;
          }
        }
      }
      __stream = _stderr;
      puVar6 = (undefined4 *)coda_get_errno();
      uVar7 = coda_errno_to_string(*puVar6);
      fprintf(__stream,"ERROR: %s\n",uVar7);
LAB_0010156d:
      exit(1);
    }
  }
  print_help();
LAB_0010157a:
  exit(0);
}

Assistant:

int main(int argc, char *argv[])
{
    char *filter = NULL;
    int perform_conversions;
    int i;

    verbosity = 0;
    perform_conversions = 1;

    if (argc == 1 || strcmp(argv[1], "-h") == 0 || strcmp(argv[1], "--help") == 0)
    {
        print_help();
        exit(0);
    }

    if (strcmp(argv[1], "-v") == 0 || strcmp(argv[1], "--version") == 0)
    {
        print_version();
        exit(0);
    }

    i = 1;
    if (i + 1 < argc && strcmp(argv[i], "-D") == 0)
    {
        coda_set_definition_path(argv[i + 1]);
        i += 2;
    }
    else
    {
        const char *definition_path = "../share/" PACKAGE "/definitions";

        if (coda_set_definition_path_conditional(argv[0], NULL, definition_path) != 0)
        {
            fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
            exit(1);
        }
    }

    while (i < argc)
    {
        if (strcmp(argv[i], "-d") == 0 || strcmp(argv[i], "--disable_conversions") == 0)
        {
            perform_conversions = 0;
        }
        else if ((strcmp(argv[i], "-f") == 0 || strcmp(argv[i], "--filter") == 0) &&
                 i + 1 < argc && argv[i + 1][0] != '-')
        {
            filter = argv[i + 1];
            i++;
        }
        else if (strcmp(argv[i], "-V") == 0 || strcmp(argv[i], "--verbosity") == 0)
        {
            verbosity = 1;
        }
        else if (argv[i][0] != '-')
        {
            /* assume all arguments from here on are files */
            break;
        }
        else
        {
            fprintf(stderr, "ERROR: invalid arguments\n");
            print_help();
            exit(1);
        }
        i++;
    }

    if (i == argc)
    {
        /* no files or directories provided */
        fprintf(stderr, "ERROR: invalid arguments\n");
        print_help();
        exit(1);
    }

    if (coda_init() != 0)
    {
        fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
        exit(1);
    }

    coda_set_option_perform_conversions(perform_conversions);

    if (coda_match_filefilter(filter, argc - i, (const char **)&argv[i], &callback, NULL) != 0)
    {
        fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
        exit(1);
    }

    coda_done();

    return 0;
}